

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oid.c
# Opt level: O0

int mbedtls_oid_get_numeric_string(char *buf,size_t size,mbedtls_asn1_buf *oid)

{
  int iVar1;
  char *local_50;
  char *p;
  size_t sStack_40;
  uint value;
  size_t n;
  size_t i;
  int ret;
  mbedtls_asn1_buf *oid_local;
  size_t size_local;
  char *buf_local;
  
  local_50 = buf;
  sStack_40 = size;
  if (oid->len != 0) {
    iVar1 = snprintf(buf,size,"%d.%d",(ulong)*oid->p / 0x28,(ulong)*oid->p % 0x28);
    if ((iVar1 < 0) || (size <= (ulong)(long)iVar1)) {
      return -0xb;
    }
    sStack_40 = size - (long)iVar1;
    local_50 = buf + iVar1;
  }
  p._4_4_ = 0;
  n = 1;
  while( true ) {
    if (oid->len <= n) {
      return (int)size - (int)sStack_40;
    }
    if ((p._4_4_ & 0x1ffffff) != p._4_4_) break;
    p._4_4_ = (oid->p[n] & 0x7f) + p._4_4_ * 0x80;
    if ((oid->p[n] & 0x80) == 0) {
      iVar1 = snprintf(local_50,sStack_40,".%d",(ulong)p._4_4_);
      if ((iVar1 < 0) || (sStack_40 <= (ulong)(long)iVar1)) {
        return -0xb;
      }
      sStack_40 = sStack_40 - (long)iVar1;
      local_50 = local_50 + iVar1;
      p._4_4_ = 0;
    }
    n = n + 1;
  }
  return -0xb;
}

Assistant:

int mbedtls_oid_get_numeric_string( char *buf, size_t size,
                            const mbedtls_asn1_buf *oid )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i, n;
    unsigned int value;
    char *p;

    p = buf;
    n = size;

    /* First byte contains first two dots */
    if( oid->len > 0 )
    {
        ret = mbedtls_snprintf( p, n, "%d.%d", oid->p[0] / 40, oid->p[0] % 40 );
        OID_SAFE_SNPRINTF;
    }

    value = 0;
    for( i = 1; i < oid->len; i++ )
    {
        /* Prevent overflow in value. */
        if( ( ( value << 7 ) >> 7 ) != value )
            return( MBEDTLS_ERR_OID_BUF_TOO_SMALL );

        value <<= 7;
        value += oid->p[i] & 0x7F;

        if( !( oid->p[i] & 0x80 ) )
        {
            /* Last byte */
            ret = mbedtls_snprintf( p, n, ".%d", value );
            OID_SAFE_SNPRINTF;
            value = 0;
        }
    }

    return( (int) ( size - n ) );
}